

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_FormatMoney::test_method(util_FormatMoney *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffeef8;
  char *in_stack_ffffffffffffef00;
  char *in_stack_ffffffffffffef08;
  const_string *in_stack_ffffffffffffef20;
  const_string *msg;
  size_t in_stack_ffffffffffffef28;
  undefined1 *line_num;
  const_string *in_stack_ffffffffffffef30;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffef38;
  char *this_00;
  CAmount in_stack_ffffffffffffef50;
  undefined1 *n;
  util_FormatMoney *this_local;
  undefined1 local_c48 [16];
  undefined1 local_c38 [32];
  const_string local_c18;
  undefined1 local_c08 [16];
  undefined1 local_bf8 [16];
  undefined1 local_be8 [48];
  undefined1 local_bb8 [16];
  undefined1 local_ba8 [16];
  undefined1 local_b98 [64];
  undefined1 local_b58 [16];
  undefined1 local_b48 [64];
  undefined1 local_b08 [16];
  undefined1 local_af8 [64];
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [64];
  undefined1 local_a68 [16];
  undefined1 local_a58 [64];
  undefined1 local_a18 [16];
  undefined1 local_a08 [64];
  undefined1 local_9c8 [16];
  undefined1 local_9b8 [64];
  undefined1 local_978 [16];
  undefined1 local_968 [64];
  undefined1 local_928 [16];
  undefined1 local_918 [64];
  undefined1 local_8d8 [16];
  undefined1 local_8c8 [64];
  undefined1 local_888 [16];
  undefined1 local_878 [64];
  undefined1 local_838 [16];
  undefined1 local_828 [64];
  undefined1 local_7e8 [16];
  undefined1 local_7d8 [64];
  undefined1 local_798 [16];
  undefined1 local_788 [64];
  undefined1 local_748 [16];
  undefined1 local_738 [64];
  undefined1 local_6f8 [16];
  undefined1 local_6e8 [64];
  undefined1 local_6a8 [16];
  undefined1 local_698 [64];
  undefined1 local_658 [16];
  undefined1 local_648 [64];
  undefined1 local_608 [16];
  undefined1 local_5f8 [64];
  undefined1 local_5b8 [16];
  undefined1 local_5a8 [64];
  undefined1 local_568 [16];
  undefined1 local_558 [64];
  undefined1 local_518 [16];
  undefined1 local_508 [64];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [64];
  undefined1 local_478 [16];
  undefined1 local_468 [64];
  undefined1 local_428 [16];
  undefined1 local_418 [64];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [64];
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_348 [32];
  undefined1 local_328 [32];
  undefined1 local_308 [32];
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [32];
  undefined1 local_2a8 [32];
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  undefined1 local_208 [32];
  undefined1 local_1e8 [32];
  undefined1 local_1c8 [32];
  undefined1 local_1a8 [32];
  undefined1 local_188 [32];
  undefined1 local_168 [32];
  undefined1 local_148 [32];
  undefined1 local_128 [32];
  undefined1 local_108 [32];
  undefined1 local_e8 [32];
  undefined1 local_c8 [32];
  undefined1 local_a8 [32];
  undefined1 local_88 [32];
  undefined1 local_68 [32];
  undefined1 local_48 [32];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.00\"";
    in_stack_ffffffffffffef00 = "0.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_3c8,local_3d8,0x158,1,2,local_28);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"12345.6789\"";
    in_stack_ffffffffffffef00 = "12345.6789";
    in_stack_ffffffffffffeef8 = "FormatMoney((COIN/10000)*123456789)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_418,local_428,0x159,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"-1.00\"";
    in_stack_ffffffffffffef00 = "-1.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(-COIN)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_468,local_478,0x15a,1,2,local_68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"100000000.00\"";
    in_stack_ffffffffffffef00 = "100000000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*100000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[13]>
              (local_4b8,local_4c8,0x15c,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"10000000.00\"";
    in_stack_ffffffffffffef00 = "10000000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*10000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[12]>
              (local_508,local_518,0x15d,1,2,local_a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"1000000.00\"";
    in_stack_ffffffffffffef00 = "1000000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*1000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_558,local_568,0x15e,1,2,local_c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"100000.00\"";
    in_stack_ffffffffffffef00 = "100000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*100000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_5a8,local_5b8,0x15f,1,2,local_e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"10000.00\"";
    in_stack_ffffffffffffef00 = "10000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*10000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_5f8,local_608,0x160,1,2,local_108);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"1000.00\"";
    in_stack_ffffffffffffef00 = "1000.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*1000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_648,local_658,0x161,1,2,local_128);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"100.00\"";
    in_stack_ffffffffffffef00 = "100.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*100)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_698,local_6a8,0x162,1,2,local_148);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"10.00\"";
    in_stack_ffffffffffffef00 = "10.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN*10)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_6e8,local_6f8,0x163,1,2,local_168);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"1.00\"";
    in_stack_ffffffffffffef00 = "1.00";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_738,local_748,0x164,1,2,local_188);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.10\"";
    in_stack_ffffffffffffef00 = "0.10";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/10)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_788,local_798,0x165,1,2,local_1a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.01\"";
    in_stack_ffffffffffffef00 = "0.01";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/100)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[5]>
              (local_7d8,local_7e8,0x166,1,2,local_1c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.001\"";
    in_stack_ffffffffffffef00 = "0.001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/1000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[6]>
              (local_828,local_838,0x167,1,2,local_1e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.0001\"";
    in_stack_ffffffffffffef00 = "0.0001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/10000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
              (local_878,local_888,0x168,1,2,local_208);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.00001\"";
    in_stack_ffffffffffffef00 = "0.00001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/100000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
              (local_8c8,local_8d8,0x169,1,2,local_228);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.000001\"";
    in_stack_ffffffffffffef00 = "0.000001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/1000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[9]>
              (local_918,local_928,0x16a,1,2,local_248);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.0000001\"";
    in_stack_ffffffffffffef00 = "0.0000001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/10000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[10]>
              (local_968,local_978,0x16b,1,2,local_268);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"0.00000001\"";
    in_stack_ffffffffffffef00 = "0.00000001";
    in_stack_ffffffffffffeef8 = "FormatMoney(COIN/100000000)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_9b8,local_9c8,0x16c,1,2,local_288);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::max();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"92233720368.54775807\"";
    in_stack_ffffffffffffef00 = "92233720368.54775807";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::max())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_a08,local_a18,0x16e,1,2,local_2a8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::max();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"92233720368.54775806\"";
    in_stack_ffffffffffffef00 = "92233720368.54775806";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::max() - 1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_a58,local_a68,0x16f,1,2,local_2c8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::max();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"92233720368.54775805\"";
    in_stack_ffffffffffffef00 = "92233720368.54775805";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::max() - 2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_aa8,local_ab8,0x170,1,2,local_2e8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::max();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"92233720368.54775804\"";
    in_stack_ffffffffffffef00 = "92233720368.54775804";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::max() - 3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[21]>
              (local_af8,local_b08,0x171,1,2,local_308);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::min();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"-92233720368.54775805\"";
    in_stack_ffffffffffffef00 = "-92233720368.54775805";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::min() + 3)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_b48,local_b58,0x173,1,2,local_328);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::min();
    FormatMoney_abi_cxx11_(in_stack_ffffffffffffef50);
    in_stack_ffffffffffffef08 = "\"-92233720368.54775806\"";
    in_stack_ffffffffffffef00 = "-92233720368.54775806";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::min() + 2)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_b98,local_ba8,0x174,1,2,local_348);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    n = local_bb8;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
               in_stack_ffffffffffffef20);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::min();
    FormatMoney_abi_cxx11_((CAmount)n);
    in_stack_ffffffffffffef08 = "\"-92233720368.54775807\"";
    in_stack_ffffffffffffef00 = "-92233720368.54775807";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::min() + 1)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_be8,local_bf8,0x175,1,2,local_368);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    this_00 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_tests.cpp"
    ;
    line_num = local_c08;
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    file = &local_c18;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffeef8);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,file,(size_t)line_num,msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffef00,(char (*) [1])in_stack_ffffffffffffeef8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffef08,in_stack_ffffffffffffef00,
               (unsigned_long)in_stack_ffffffffffffeef8);
    std::numeric_limits<long>::min();
    FormatMoney_abi_cxx11_((CAmount)n);
    in_stack_ffffffffffffef08 = "\"-92233720368.54775808\"";
    in_stack_ffffffffffffef00 = "-92233720368.54775808";
    in_stack_ffffffffffffeef8 = "FormatMoney(std::numeric_limits<CAmount>::min())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[22]>
              (local_c38,local_c48,0x176,1,2,local_388);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffeef8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffeef8);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_FormatMoney)
{
    BOOST_CHECK_EQUAL(FormatMoney(0), "0.00");
    BOOST_CHECK_EQUAL(FormatMoney((COIN/10000)*123456789), "12345.6789");
    BOOST_CHECK_EQUAL(FormatMoney(-COIN), "-1.00");

    BOOST_CHECK_EQUAL(FormatMoney(COIN*100000000), "100000000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*10000000), "10000000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*1000000), "1000000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*100000), "100000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*10000), "10000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*1000), "1000.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*100), "100.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN*10), "10.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN), "1.00");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/10), "0.10");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/100), "0.01");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/1000), "0.001");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/10000), "0.0001");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/100000), "0.00001");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/1000000), "0.000001");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/10000000), "0.0000001");
    BOOST_CHECK_EQUAL(FormatMoney(COIN/100000000), "0.00000001");

    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::max()), "92233720368.54775807");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::max() - 1), "92233720368.54775806");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::max() - 2), "92233720368.54775805");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::max() - 3), "92233720368.54775804");
    // ...
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::min() + 3), "-92233720368.54775805");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::min() + 2), "-92233720368.54775806");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::min() + 1), "-92233720368.54775807");
    BOOST_CHECK_EQUAL(FormatMoney(std::numeric_limits<CAmount>::min()), "-92233720368.54775808");
}